

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this,
          TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *cp)

{
  long in_RSI;
  TPZVec<int> *in_RDI;
  TPZAbstractFrontMatrix<float> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *copy;
  TPZStackEqnStorage<float> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<float,TPZStackEqnStorage<float>,TPZFrontNonSym<float>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZAbstractFrontMatrix<float>::TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<float> *)in_RDI,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZFrontMatrix_025425d8;
  TPZStackEqnStorage<float>::TPZStackEqnStorage
            (in_stack_ffffffffffffffd0,(TPZStackEqnStorage<float> *)(in_RDI + 1));
  copy = (TPZVec<int> *)&in_RDI[0xaed].fStore;
  TPZFrontNonSym<float>::TPZFrontNonSym
            ((TPZFrontNonSym<float> *)in_RDI,(TPZFrontNonSym<float> *)copy);
  in_RDI[0xaf6].fNElements = *(int64_t *)(in_RSI + 0x15ed0);
  in_RDI[0xaf6].fNAlloc = *(int64_t *)(in_RSI + 0x15ed8);
  TPZVec<int>::TPZVec(in_RDI,copy);
  TPZVec<int>::TPZVec(in_RDI,copy);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }